

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O2

int CharacterDecodingHokuyo(char *buf,int buflen)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)buflen;
  if (buflen < 1) {
    uVar3 = uVar2;
  }
  uVar1 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = uVar1 << 6 | (int)buf[uVar2] - 0x30U;
  }
  return uVar1;
}

Assistant:

inline int CharacterDecodingHokuyo(char* buf, int buflen)
{
	int i = 0, value = 0;

	for (i = 0; i < buflen; i++)
	{
		value <<= 6;
		value &= ~0x3f;
		value |= buf[i] - 0x30;
	}

	return value;
}